

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread_info_base.hpp
# Opt level: O2

void __thiscall asio::detail::thread_info_base::capture_current_exception(thread_info_base *this)

{
  multiple_exceptions *this_00;
  multiple_exceptions local_40;
  undefined **local_30;
  exception_ptr local_28;
  
  if (this->has_pending_exception_ == 1) {
    this->has_pending_exception_ = 2;
    this_00 = (multiple_exceptions *)&local_40.first_;
    std::__exception_ptr::exception_ptr::exception_ptr
              ((exception_ptr *)this_00,&this->pending_exception_);
    local_30 = &PTR__multiple_exceptions_005c59c0;
    local_28._M_exception_object = local_40.first_._M_exception_object;
    local_40.first_._M_exception_object = (void *)0x0;
    std::make_exception_ptr<asio::multiple_exceptions>(&local_40);
    std::__exception_ptr::exception_ptr::operator=
              (&this->pending_exception_,(exception_ptr *)&local_40);
    std::__exception_ptr::exception_ptr::~exception_ptr((exception_ptr *)&local_40);
    multiple_exceptions::~multiple_exceptions((multiple_exceptions *)&local_30);
  }
  else {
    if (this->has_pending_exception_ != 0) {
      return;
    }
    this->has_pending_exception_ = 1;
    this_00 = &local_40;
    std::current_exception();
    std::__exception_ptr::exception_ptr::operator=
              (&this->pending_exception_,(exception_ptr *)this_00);
  }
  std::__exception_ptr::exception_ptr::~exception_ptr((exception_ptr *)this_00);
  return;
}

Assistant:

void capture_current_exception()
  {
#if defined(ASIO_HAS_STD_EXCEPTION_PTR) \
  && !defined(ASIO_NO_EXCEPTIONS)
    switch (has_pending_exception_)
    {
    case 0:
      has_pending_exception_ = 1;
      pending_exception_ = std::current_exception();
      break;
    case 1:
      has_pending_exception_ = 2;
      pending_exception_ =
        std::make_exception_ptr<multiple_exceptions>(
            multiple_exceptions(pending_exception_));
      break;
    default:
      break;
    }
#endif // defined(ASIO_HAS_STD_EXCEPTION_PTR)
       // && !defined(ASIO_NO_EXCEPTIONS)
  }